

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O2

Constant *
spvtools::opt::anon_unknown_0::FoldFPBinaryOp
          (BinaryScalarFoldingRule *scalar_rule,uint32_t result_type_id,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants,IRContext *context)

{
  Constant *__args_2;
  pointer ppCVar1;
  int iVar2;
  uint uVar3;
  ConstantManager *__args_3;
  TypeManager *this;
  Type *__args;
  undefined4 extraout_var;
  Instruction *this_00;
  Constant *pCVar4;
  ulong uVar5;
  iterator __begin3;
  pointer ppCVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  results_components;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  a_components;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  b_components;
  uint32_t local_ac;
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_a8;
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_88;
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_68;
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_48;
  Type *type;
  
  __args_3 = IRContext::get_constant_mgr(context);
  this = IRContext::get_type_mgr(context);
  __args = analysis::TypeManager::GetType(this,result_type_id);
  iVar2 = (*__args->_vptr_Type[0xe])(__args);
  type = (Type *)CONCAT44(extraout_var,iVar2);
  ppCVar6 = (constants->
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = *ppCVar6;
  if ((pCVar4 == (Constant *)0x0) || (__args_2 = ppCVar6[1], __args_2 == (Constant *)0x0)) {
    return (Constant *)0x0;
  }
  if (type == (Type *)0x0) {
    pCVar4 = std::
             function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
             ::operator()(scalar_rule,__args,pCVar4,__args_2,__args_3);
    return pCVar4;
  }
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  analysis::Constant::GetVectorComponents
            ((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              *)&local_a8,pCVar4,__args_3);
  std::
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::_M_move_assign((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    *)&local_68,&local_a8);
  std::
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::~_Vector_base(&local_a8);
  analysis::Constant::GetVectorComponents
            ((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              *)&local_a8,
             (constants->
             super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
             )._M_impl.super__Vector_impl_data._M_start[1],__args_3);
  std::
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::_M_move_assign((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    *)&local_48,&local_a8);
  std::
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::~_Vector_base(&local_a8);
  uVar3 = 0;
  ppCVar6 = (pointer)0x0;
  do {
    ppCVar1 = local_88._M_impl.super__Vector_impl_data._M_finish;
    uVar5 = (ulong)uVar3;
    if ((ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                (long)local_68._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar5) {
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (; ppCVar6 != ppCVar1; ppCVar6 = ppCVar6 + 1) {
        this_00 = analysis::ConstantManager::GetDefiningInstruction
                            (__args_3,*ppCVar6,0,(inst_iterator *)0x0);
        local_ac = Instruction::result_id(this_00);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,&local_ac);
      }
      pCVar4 = analysis::ConstantManager::GetConstant
                         (__args_3,type,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
      goto LAB_0049687f;
    }
    local_a8._M_impl.super__Vector_impl_data._M_start =
         (pointer)std::
                  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
                  ::operator()(scalar_rule,(Type *)type[1]._vptr_Type,
                               local_68._M_impl.super__Vector_impl_data._M_start[uVar5],
                               local_48._M_impl.super__Vector_impl_data._M_start[uVar5],__args_3);
    std::
    vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
    ::emplace_back<spvtools::opt::analysis::Constant_const*>
              ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
                *)&local_88,(Constant **)&local_a8);
    uVar3 = uVar3 + 1;
    ppCVar6 = local_88._M_impl.super__Vector_impl_data._M_start;
  } while (local_88._M_impl.super__Vector_impl_data._M_start[uVar5] != (Constant *)0x0);
  pCVar4 = (Constant *)0x0;
LAB_0049687f:
  std::
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::~_Vector_base(&local_88);
  std::
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::~_Vector_base(&local_48);
  std::
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::~_Vector_base(&local_68);
  return pCVar4;
}

Assistant:

const analysis::Constant* FoldFPBinaryOp(
    BinaryScalarFoldingRule scalar_rule, uint32_t result_type_id,
    const std::vector<const analysis::Constant*>& constants,
    IRContext* context) {
  analysis::ConstantManager* const_mgr = context->get_constant_mgr();
  analysis::TypeManager* type_mgr = context->get_type_mgr();
  const analysis::Type* result_type = type_mgr->GetType(result_type_id);
  const analysis::Vector* vector_type = result_type->AsVector();

  if (constants[0] == nullptr || constants[1] == nullptr) {
    return nullptr;
  }

  if (vector_type != nullptr) {
    std::vector<const analysis::Constant*> a_components;
    std::vector<const analysis::Constant*> b_components;
    std::vector<const analysis::Constant*> results_components;

    a_components = constants[0]->GetVectorComponents(const_mgr);
    b_components = constants[1]->GetVectorComponents(const_mgr);

    // Fold each component of the vector.
    for (uint32_t i = 0; i < a_components.size(); ++i) {
      results_components.push_back(scalar_rule(vector_type->element_type(),
                                               a_components[i], b_components[i],
                                               const_mgr));
      if (results_components[i] == nullptr) {
        return nullptr;
      }
    }

    // Build the constant object and return it.
    std::vector<uint32_t> ids;
    for (const analysis::Constant* member : results_components) {
      ids.push_back(const_mgr->GetDefiningInstruction(member)->result_id());
    }
    return const_mgr->GetConstant(vector_type, ids);
  } else {
    return scalar_rule(result_type, constants[0], constants[1], const_mgr);
  }
}